

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

SQRESULT sq_stackinfos(HSQUIRRELVM v,SQInteger level,SQStackInfos *si)

{
  undefined8 *puVar1;
  long lVar2;
  SQFunctionProto *this;
  SQInteger SVar3;
  long *in_RDX;
  ulong in_RSI;
  long in_RDI;
  SQFunctionProto *func;
  CallInfo *ci;
  SQInteger cssize;
  SQRESULT local_8;
  
  lVar2 = *(long *)(in_RDI + 200);
  if ((long)in_RSI < lVar2) {
    *in_RDX = 0;
    in_RDX[1] = 0;
    in_RDX[2] = 0;
    puVar1 = (undefined8 *)(*(long *)(in_RDI + 0xc0) + (~in_RSI + lVar2) * 0x48);
    if (*(int *)(puVar1 + 2) == 0x8000100) {
      this = *(SQFunctionProto **)(puVar1[3] + 0x48);
      if ((this->_name).super_SQObject._type == OT_STRING) {
        *in_RDX = (long)&((this->_name).super_SQObject._unVal.pTable)->_firstfree;
      }
      if ((this->_sourcename).super_SQObject._type == OT_STRING) {
        in_RDX[1] = (long)&((this->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
      }
      SVar3 = SQFunctionProto::GetLine(this,(SQInstruction *)*puVar1);
      in_RDX[2] = SVar3;
    }
    else if (*(int *)(puVar1 + 2) == 0x8000200) {
      in_RDX[1] = (long)"NATIVE";
      *in_RDX = (long)"unknown";
      if (*(int *)(puVar1[3] + 0x70) == 0x8000010) {
        *in_RDX = *(long *)(puVar1[3] + 0x78) + 0x38;
      }
      in_RDX[2] = -1;
    }
    local_8 = 0;
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

SQRESULT sq_stackinfos(HSQUIRRELVM v, SQInteger level, SQStackInfos *si)
{
    SQInteger cssize = v->_callsstacksize;
    if (cssize > level) {
        memset(si, 0, sizeof(SQStackInfos));
        SQVM::CallInfo &ci = v->_callsstack[cssize-level-1];
        switch (sq_type(ci._closure)) {
        case OT_CLOSURE:{
            SQFunctionProto *func = _closure(ci._closure)->_function;
            if (sq_type(func->_name) == OT_STRING)
                si->funcname = _stringval(func->_name);
            if (sq_type(func->_sourcename) == OT_STRING)
                si->source = _stringval(func->_sourcename);
            si->line = func->GetLine(ci._ip);
                        }
            break;
        case OT_NATIVECLOSURE:
            si->source = _SC("NATIVE");
            si->funcname = _SC("unknown");
            if(sq_type(_nativeclosure(ci._closure)->_name) == OT_STRING)
                si->funcname = _stringval(_nativeclosure(ci._closure)->_name);
            si->line = -1;
            break;
        default: break; //shutup compiler
        }
        return SQ_OK;
    }
    return SQ_ERROR;
}